

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR buf_store_char(lysp_yang_ctx *ctx,yang_arg arg,char **word_p,size_t *word_len,char **word_b,
                     size_t *buf_len,ly_bool need_buf,uint8_t *prefix)

{
  LY_ERR LVar1;
  void *pvVar2;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_68;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  size_t len;
  size_t *psStack_40;
  uint32_t c;
  size_t *buf_len_local;
  char **word_b_local;
  size_t *word_len_local;
  char **word_p_local;
  lysp_yang_ctx *plStack_18;
  yang_arg arg_local;
  lysp_yang_ctx *ctx_local;
  
  psStack_40 = buf_len;
  buf_len_local = (size_t *)word_b;
  word_b_local = (char **)word_len;
  word_len_local = (size_t *)word_p;
  word_p_local._4_4_ = arg;
  plStack_18 = ctx;
  if ((need_buf != '\0') && ((need_buf == '\0' || (word_b == (char **)0x0)))) {
    __assert_fail("!need_buf || (need_buf && word_b)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                  ,0xae,
                  "LY_ERR buf_store_char(struct lysp_yang_ctx *, enum yang_arg, char **, size_t *, char **, size_t *, ly_bool, uint8_t *)"
                 );
  }
  LVar1 = ly_getutf8(&ctx->in->current,(uint32_t *)((long)&len + 4),(size_t *)&ret___1);
  if (LVar1 != LY_SUCCESS) {
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_68 = (ly_ctx *)0x0;
    }
    else {
      local_68 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    ly_vlog(local_68,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",
            (ulong)(uint)(int)plStack_18->in->current[-_ret___1]);
    return LY_EVALID;
  }
  plStack_18->in->current = plStack_18->in->current + -_ret___1;
  if (len._4_4_ == 10) {
    plStack_18->indent = 0;
    plStack_18->in->line = plStack_18->in->line + 1;
  }
  else {
    plStack_18->indent = plStack_18->indent + 1;
  }
  if (word_p_local._4_4_ == Y_IDENTIF_ARG) {
    LVar1 = lysp_check_identifierchar
                      ((lysp_ctx *)plStack_18,len._4_4_,(*word_b_local != (char *)0x0 ^ 0xffU) & 1,
                       (uint8_t *)0x0);
  }
  else if (word_p_local._4_4_ == Y_PREF_IDENTIF_ARG) {
    LVar1 = lysp_check_identifierchar
                      ((lysp_ctx *)plStack_18,len._4_4_,(*word_b_local != (char *)0x0 ^ 0xffU) & 1,
                       prefix);
  }
  else {
    if (1 < word_p_local._4_4_ - Y_STR_ARG) goto LAB_001b9b37;
    LVar1 = lysp_check_stringchar((lysp_ctx *)plStack_18,len._4_4_);
  }
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
LAB_001b9b37:
  if ((buf_len_local == (size_t *)0x0) || (*buf_len_local == 0)) {
    if ((buf_len_local == (size_t *)0x0) || (need_buf == '\0')) {
      if (*word_len_local == 0) {
        *word_len_local = (size_t)plStack_18->in->current;
      }
      *word_b_local = *word_b_local + _ret___1;
      ly_in_skip(plStack_18->in,_ret___1);
    }
    else {
      if (*word_b_local != (char *)0x0) {
        pvVar2 = malloc((size_t)*word_b_local);
        *buf_len_local = (size_t)pvVar2;
        if (*buf_len_local == 0) {
          if (plStack_18 == (lysp_yang_ctx *)0x0) {
            local_80 = (ly_ctx *)0x0;
          }
          else {
            local_80 = (ly_ctx *)
                       **(undefined8 **)
                         (plStack_18->parsed_mods->field_2).dnodes
                         [plStack_18->parsed_mods->count - 1];
          }
          ly_log(local_80,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","buf_store_char");
          return LY_EMEM;
        }
        *psStack_40 = (size_t)*word_b_local;
        memcpy((void *)*buf_len_local,(void *)*word_len_local,(size_t)*word_b_local);
      }
      if (plStack_18 == (lysp_yang_ctx *)0x0) {
        local_88 = (ly_ctx *)0x0;
      }
      else {
        local_88 = (ly_ctx *)
                   **(undefined8 **)
                     (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
      }
      LVar1 = buf_add_char(local_88,plStack_18->in,_ret___1,(char **)buf_len_local,psStack_40,
                           (size_t *)word_b_local);
      if (LVar1 != LY_SUCCESS) {
        return LY_EMEM;
      }
      *word_len_local = *buf_len_local;
    }
  }
  else {
    if (plStack_18 == (lysp_yang_ctx *)0x0) {
      local_78 = (ly_ctx *)0x0;
    }
    else {
      local_78 = (ly_ctx *)
                 **(undefined8 **)
                   (plStack_18->parsed_mods->field_2).dnodes[plStack_18->parsed_mods->count - 1];
    }
    LVar1 = buf_add_char(local_78,plStack_18->in,_ret___1,(char **)buf_len_local,psStack_40,
                         (size_t *)word_b_local);
    if (LVar1 != LY_SUCCESS) {
      return LY_EMEM;
    }
    *word_len_local = *buf_len_local;
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
buf_store_char(struct lysp_yang_ctx *ctx, enum yang_arg arg, char **word_p, size_t *word_len,
        char **word_b, size_t *buf_len, ly_bool need_buf, uint8_t *prefix)
{
    uint32_t c;
    size_t len;

    /* check  valid combination of input paremeters - if need_buf specified, word_b must be provided */
    assert(!need_buf || (need_buf && word_b));

    /* get UTF8 code point (and number of bytes coding the character) */
    LY_CHECK_ERR_RET(ly_getutf8(&ctx->in->current, &c, &len),
            LOGVAL_PARSER(ctx, LY_VCODE_INCHAR, ctx->in->current[-len]), LY_EVALID);
    ctx->in->current -= len;
    if (c == '\n') {
        ctx->indent = 0;
        LY_IN_NEW_LINE(ctx->in);
    } else {
        /* note - even the multibyte character is count as 1 */
        ++ctx->indent;
    }

    /* check character validity */
    switch (arg) {
    case Y_IDENTIF_ARG:
        LY_CHECK_RET(lysp_check_identifierchar((struct lysp_ctx *)ctx, c, !(*word_len), NULL));
        break;
    case Y_PREF_IDENTIF_ARG:
        LY_CHECK_RET(lysp_check_identifierchar((struct lysp_ctx *)ctx, c, !(*word_len), prefix));
        break;
    case Y_STR_ARG:
    case Y_MAYBE_STR_ARG:
        LY_CHECK_RET(lysp_check_stringchar((struct lysp_ctx *)ctx, c));
        break;
    }

    if (word_b && *word_b) {
        /* add another character into buffer */
        if (buf_add_char(PARSER_CTX(ctx), ctx->in, len, word_b, buf_len, word_len)) {
            return LY_EMEM;
        }

        /* in case of realloc */
        *word_p = *word_b;
    } else if (word_b && need_buf) {
        /* first time we need a buffer, copy everything read up to now */
        if (*word_len) {
            *word_b = malloc(*word_len);
            LY_CHECK_ERR_RET(!*word_b, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
            *buf_len = *word_len;
            memcpy(*word_b, *word_p, *word_len);
        }

        /* add this new character into buffer */
        if (buf_add_char(PARSER_CTX(ctx), ctx->in, len, word_b, buf_len, word_len)) {
            return LY_EMEM;
        }

        /* in case of realloc */
        *word_p = *word_b;
    } else {
        /* just remember the first character pointer */
        if (!*word_p) {
            *word_p = (char *)ctx->in->current;
        }
        /* ... and update the word's length */
        (*word_len) += len;
        ly_in_skip(ctx->in, len);
    }

    return LY_SUCCESS;
}